

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifier.cpp
# Opt level: O3

bool __thiscall
vkt::texture::SampleVerifier::verifySampleReport
          (SampleVerifier *this,SampleArguments *args,Vec4 *result,string *report)

{
  bool bVar1;
  ostringstream reportStream;
  long *local_1c0 [2];
  long local_1b0 [2];
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  bVar1 = verifySampleImpl(this,args,result,(ostream *)local_1a0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)report,(string *)local_1c0);
  if (local_1c0[0] != local_1b0) {
    operator_delete(local_1c0[0],local_1b0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  return bVar1;
}

Assistant:

bool SampleVerifier::verifySampleReport (const SampleArguments&	args,
										 const Vec4&			result,
										 std::string&			report) const
{
	std::ostringstream reportStream;

	const bool isValid = verifySampleImpl(args, result, reportStream);

	report = reportStream.str();

    return isValid;
}